

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

ushort prsxsst(prscxdef *ctx)

{
  uchar *puVar1;
  
  if (1 < ctx->prscxnrem) {
    puVar1 = ctx->prscxnode + (-0xd0 - (long)ctx);
    ctx->prscxsofs = (uint)puVar1;
    ctx->prscxnode = ctx->prscxnode + 2;
    ctx->prscxnrem = ctx->prscxnrem - 2;
    ctx->prscxslen = 2;
    return (ushort)puVar1;
  }
  errsigf(ctx->prscxerr,"TADS",0x131);
}

Assistant:

ushort prsxsst(prscxdef *ctx)
{
    /* make sure there's space for the length prefix (a ushort) */
    if (ctx->prscxnrem < 2)
        errsig(ctx->prscxerr, ERR_NONODE);
    
    ctx->prscxsofs = ctx->prscxnode - &ctx->prscxpool[0];
    ctx->prscxnode += 2;
    ctx->prscxnrem -= 2;
    ctx->prscxslen = 2;
    return(ctx->prscxsofs);
}